

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O0

base_learner *
ExpReplay::expreplay_setup<(char)99,COST_SENSITIVE::cs_label>(options_i *options,vw *all)

{
  byte bVar1;
  pointer peVar2;
  example *peVar3;
  bool *pbVar4;
  ostream *poVar5;
  base_learner *dat;
  single_learner *base;
  vw *pvVar6;
  vw *in_RSI;
  long *in_RDI;
  learner<ExpReplay::expreplay,_example> *l;
  size_t n;
  option_group_definition new_options;
  free_ptr<ExpReplay::expreplay> er;
  string replay_count_string;
  string replay_string;
  string *in_stack_fffffffffffffc58;
  _func_void_expreplay_ptr_learner<char,_example>_ptr_example_ptr *predict;
  vw *in_stack_fffffffffffffc60;
  string *in_stack_fffffffffffffc68;
  typed_option<unsigned_long> *in_stack_fffffffffffffc70;
  _func_void_expreplay_ptr *in_stack_fffffffffffffc78;
  learner<ExpReplay::expreplay,_example> *in_stack_fffffffffffffc80;
  typed_option<unsigned_long> *in_stack_fffffffffffffca8;
  option_group_definition *in_stack_fffffffffffffcb0;
  ulong uVar7;
  label_t local_2d8;
  wclass *local_2d0;
  wclass *local_2c8;
  size_t local_2c0;
  ulong local_2b8;
  allocator local_2a9;
  string local_2a8 [32];
  string local_288 [168];
  learner<char,_char> *in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  allocator local_1c1;
  string local_1c0 [32];
  string local_1a0 [32];
  typed_option<unsigned_long> local_180;
  allocator local_d9;
  string local_d8 [32];
  undefined1 local_b8 [56];
  undefined1 local_80 [16];
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  vw *local_18;
  long *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"replay_",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::operator+=(local_38,'c');
  std::__cxx11::string::string(local_70,local_38);
  std::__cxx11::string::operator+=(local_70,"_count");
  scoped_calloc_or_throw<ExpReplay::expreplay>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Experience Replay",&local_d9);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::string(local_1a0,local_38);
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
            ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1d9f2f);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffc68,(unsigned_long *)in_stack_fffffffffffffc60);
  VW::config::typed_option<unsigned_long>::keep(&local_180,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c0,
             "use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost sensitive] with specified buffer size"
             ,&local_1c1);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::__cxx11::string::string(local_288,local_70);
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
            ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1d9ffc);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffffc68,(unsigned_long *)in_stack_fffffffffffffc60);
  VW::config::typed_option<unsigned_long>::default_value
            (in_stack_fffffffffffffc70,(unsigned_long)in_stack_fffffffffffffc68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2a8,
             "how many times (in expectation) should each example be played (default: 1 = permuting)"
             ,&local_2a9);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffc60);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffffc60);
  std::__cxx11::string::~string(local_1a0);
  (**(code **)*local_10)(local_10,local_b8);
  bVar1 = (**(code **)(*local_10 + 8))(local_10,local_38);
  if (((bVar1 & 1) == 0) ||
     (peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da157),
     pvVar6 = local_18, peVar2->N == 0)) {
    local_8 = (base_learner *)0x0;
  }
  else {
    peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da365);
    peVar2->all = pvVar6;
    std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
              ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da377);
    peVar3 = VW::alloc_examples((size_t)in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60)
    ;
    peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da399);
    peVar2->buf = peVar3;
    local_2b8 = 0;
    while (uVar7 = local_2b8,
          peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                             ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da3c8),
          uVar7 < peVar2->N) {
      v_init<COST_SENSITIVE::wclass>();
      peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da3f6);
      peVar3 = peVar2->buf;
      peVar3[local_2b8].l.multi = local_2d8;
      peVar3[local_2b8].l.cs.costs._end = local_2d0;
      peVar3[local_2b8].l.cs.costs.end_array = local_2c8;
      peVar3[local_2b8].l.cs.costs.erase_count = local_2c0;
      local_2b8 = local_2b8 + 1;
    }
    std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
              ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da46b);
    pbVar4 = calloc_or_throw<bool>(in_stack_fffffffffffffe28);
    peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da488);
    peVar2->filled = pbVar4;
    if ((local_18->quiet & 1U) == 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"experience replay level=");
      poVar5 = std::operator<<(poVar5,'c');
      poVar5 = std::operator<<(poVar5,", buffer=");
      peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da4fb);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,peVar2->N);
      in_stack_fffffffffffffc80 =
           (learner<ExpReplay::expreplay,_example> *)std::operator<<(poVar5,", replay count=");
      peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                         ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da535);
      in_stack_fffffffffffffc78 =
           (_func_void_expreplay_ptr *)
           std::ostream::operator<<(in_stack_fffffffffffffc80,peVar2->replay_count);
      std::ostream::operator<<(in_stack_fffffffffffffc78,std::endl<char,std::char_traits<char>>);
    }
    dat = setup_base((options_i *)in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    base = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffe20);
    predict = (_func_void_expreplay_ptr_learner<char,_example>_ptr_example_ptr *)local_80;
    peVar2 = std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
                       ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da59d);
    peVar2->base = base;
    std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::operator->
              ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)0x1da5af);
    pvVar6 = (vw *)LEARNER::
                   init_learner<ExpReplay::expreplay,example,LEARNER::learner<char,example>>
                             ((free_ptr<ExpReplay::expreplay> *)dat,base,
                              (_func_void_expreplay_ptr_learner<char,_example>_ptr_example_ptr *)
                              in_stack_fffffffffffffc60,predict);
    in_stack_fffffffffffffc60 = pvVar6;
    LEARNER::learner<ExpReplay::expreplay,_example>::set_finish
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    LEARNER::learner<ExpReplay::expreplay,_example>::set_end_pass
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    local_8 = LEARNER::make_base<ExpReplay::expreplay,example>
                        ((learner<ExpReplay::expreplay,_example> *)pvVar6);
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffffc60);
  std::unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<ExpReplay::expreplay,_void_(*)(void_*)> *)in_stack_fffffffffffffc60);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return local_8;
}

Assistant:

LEARNER::base_learner* expreplay_setup(VW::config::options_i& options, vw& all)
{
  std::string replay_string = "replay_";
  replay_string += er_level;
  std::string replay_count_string = replay_string;
  replay_count_string += "_count";

  auto er = scoped_calloc_or_throw<expreplay>();
  VW::config::option_group_definition new_options("Experience Replay");
  new_options
      .add(VW::config::make_option(replay_string, er->N)
               .keep()
               .help("use experience replay at a specified level [b=classification/regression, m=multiclass, c=cost "
                     "sensitive] with specified buffer size"))
      .add(VW::config::make_option(replay_count_string, er->replay_count)
               .default_value(1)
               .help("how many times (in expectation) should each example be played (default: 1 = permuting)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied(replay_string) || er->N == 0)
    return nullptr;

  er->all = &all;
  er->buf = VW::alloc_examples(1, er->N);

  if (er_level == 'c')
    for (size_t n = 0; n < er->N; n++) er->buf[n].l.cs.costs = v_init<COST_SENSITIVE::wclass>();

  er->filled = calloc_or_throw<bool>(er->N);

  if (!all.quiet)
    std::cerr << "experience replay level=" << er_level << ", buffer=" << er->N << ", replay count=" << er->replay_count
              << std::endl;

  er->base = LEARNER::as_singleline(setup_base(options, all));
  LEARNER::learner<expreplay, example>* l =
      &init_learner(er, er->base, predict_or_learn<true, lp>, predict_or_learn<false, lp>);
  l->set_finish(finish<lp>);
  l->set_end_pass(end_pass);

  return make_base(*l);
}